

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_state
duckdb_prepare(duckdb_connection connection,char *query,
              duckdb_prepared_statement *out_prepared_statement)

{
  bool bVar1;
  PreparedStatementWrapper *this;
  pointer this_00;
  undefined8 *in_RDX;
  char *in_RSI;
  Connection *in_RDI;
  Connection *conn;
  PreparedStatementWrapper *wrapper;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  *in_stack_ffffffffffffff68;
  allocator local_59;
  string local_58 [40];
  Connection *local_30;
  PreparedStatementWrapper *local_28;
  undefined8 *local_20;
  char *local_18;
  Connection *local_10;
  duckdb_state local_4;
  
  if (((in_RDI == (Connection *)0x0) || (in_RSI == (char *)0x0)) || (in_RDX == (undefined8 *)0x0)) {
    local_4 = DuckDBError;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    this = (PreparedStatementWrapper *)operator_new(0x40);
    (this->values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (this->statement).
    super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
    .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
         (PreparedStatement *)0x0;
    *(undefined8 *)&(this->values)._M_h._M_rehash_policy = 0;
    (this->values)._M_h._M_rehash_policy._M_next_resize = 0;
    (this->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->values)._M_h._M_element_count = 0;
    (this->values)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->values)._M_h._M_bucket_count = 0;
    duckdb::PreparedStatementWrapper::PreparedStatementWrapper(this);
    local_30 = local_10;
    local_28 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,local_18,&local_59);
    duckdb::Connection::Prepare(local_10,(string *)this);
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    operator=((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               *)this,in_stack_ffffffffffffff68);
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    ~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 *)0x1914f89);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    *local_20 = local_28;
    this_00 = duckdb::
              unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                            *)this);
    bVar1 = duckdb::PreparedStatement::HasError(this_00);
    local_4 = (duckdb_state)(((bVar1 ^ 0xffU) & 1) == 0);
  }
  return local_4;
}

Assistant:

duckdb_state duckdb_prepare(duckdb_connection connection, const char *query,
                            duckdb_prepared_statement *out_prepared_statement) {
	if (!connection || !query || !out_prepared_statement) {
		return DuckDBError;
	}
	auto wrapper = new PreparedStatementWrapper();
	Connection *conn = reinterpret_cast<Connection *>(connection);
	wrapper->statement = conn->Prepare(query);
	*out_prepared_statement = reinterpret_cast<duckdb_prepared_statement>(wrapper);
	return !wrapper->statement->HasError() ? DuckDBSuccess : DuckDBError;
}